

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

parser_error parse_class_spell(parser *p)

{
  wchar_t wVar1;
  void *pvVar2;
  long lVar3;
  undefined8 *puVar4;
  char *pcVar5;
  class_spell *spell;
  class_book *book;
  player_class *c;
  parser *p_local;
  
  pvVar2 = parser_priv(p);
  if (pvVar2 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else if (*(int *)((long)pvVar2 + 0x108) < 1) {
    p_local._4_4_ = PARSE_ERROR_TOO_MANY_ENTRIES;
  }
  else {
    if ((*(long *)((long)pvVar2 + 0x110) == 0) ||
       (class_max_books < *(wchar_t *)((long)pvVar2 + 0x108))) {
      __assert_fail("c->magic.books && c->magic.num_books <= class_max_books",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/init.c"
                    ,0xfa1,"enum parser_error parse_class_spell(struct parser *)");
    }
    lVar3 = *(long *)((long)pvVar2 + 0x110) + (long)(*(int *)((long)pvVar2 + 0x108) + -1) * 0x20;
    if (*(wchar_t *)(lVar3 + 0xc) < book_max_spells) {
      if ((*(long *)(lVar3 + 0x18) == 0) || (*(int *)(lVar3 + 0xc) < 0)) {
        __assert_fail("book->spells && book->num_spells >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/init.c"
                      ,0xfa6,"enum parser_error parse_class_spell(struct parser *)");
      }
      puVar4 = (undefined8 *)(*(long *)(lVar3 + 0x18) + (long)*(int *)(lVar3 + 0xc) * 0x38);
      puVar4[3] = *(undefined8 *)(lVar3 + 0x10);
      pcVar5 = parser_getsym(p,"name");
      pcVar5 = string_make(pcVar5);
      *puVar4 = pcVar5;
      *(undefined4 *)(puVar4 + 4) = *(undefined4 *)((long)pvVar2 + 0x118);
      *(int *)((long)pvVar2 + 0x118) = *(int *)((long)pvVar2 + 0x118) + 1;
      *(int *)((long)puVar4 + 0x24) = *(int *)((long)pvVar2 + 0x108) + -1;
      wVar1 = parser_getint(p,"level");
      *(wchar_t *)(puVar4 + 5) = wVar1;
      wVar1 = parser_getint(p,"mana");
      *(wchar_t *)((long)puVar4 + 0x2c) = wVar1;
      wVar1 = parser_getint(p,"fail");
      *(wchar_t *)(puVar4 + 6) = wVar1;
      wVar1 = parser_getint(p,"exp");
      *(wchar_t *)((long)puVar4 + 0x34) = wVar1;
      *(int *)(lVar3 + 0xc) = *(int *)(lVar3 + 0xc) + 1;
      p_local._4_4_ = PARSE_ERROR_NONE;
    }
    else {
      p_local._4_4_ = PARSE_ERROR_TOO_MANY_ENTRIES;
    }
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_class_spell(struct parser *p) {
	struct player_class *c = parser_priv(p);
	struct class_book *book;
	struct class_spell *spell;

	if (!c) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	if (c->magic.num_books < 1) {
		/*
		 * Either missing a magic directive for the class or didn't
		 * have a book directive after the magic directive.  Use
		 * this under the assumption that without those, the maximum
		 * number of spells is zero.
		 */
		return PARSE_ERROR_TOO_MANY_ENTRIES;
	}
	assert(c->magic.books && c->magic.num_books <= class_max_books);
	book = &c->magic.books[c->magic.num_books - 1];
	if (book->num_spells >= book_max_spells) {
		return PARSE_ERROR_TOO_MANY_ENTRIES;
	}
	assert(book->spells && book->num_spells >= 0);
	spell = &book->spells[book->num_spells];
	spell->realm = book->realm;
	spell->name = string_make(parser_getsym(p, "name"));
	spell->sidx = c->magic.total_spells;
	c->magic.total_spells++;
	spell->bidx = c->magic.num_books - 1;
	spell->slevel = parser_getint(p, "level");
	spell->smana = parser_getint(p, "mana");
	spell->sfail = parser_getint(p, "fail");
	spell->sexp = parser_getint(p, "exp");
	++book->num_spells;
	return PARSE_ERROR_NONE;
}